

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3VarintLen(sqlite3_uint64 v)

{
  undefined4 local_14;
  sqlite3_uint64 sStack_10;
  int i;
  sqlite3_uint64 v_local;
  
  local_14 = 0;
  sStack_10 = v;
  do {
    local_14 = local_14 + 1;
    sStack_10 = sStack_10 >> 7;
  } while (sStack_10 != 0);
  return local_14;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3VarintLen(sqlite3_uint64 v){
  int i = 0;
  do{
    i++;
    v >>= 7;
  }while( v!=0 );
  return i;
}